

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_htmlspecialchars_decode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *zString;
  int iVar1;
  sxi32 sVar2;
  bool bVar3;
  int local_4c;
  int local_48;
  int nJump;
  int nLen;
  int iFlags;
  char *zEnd;
  char *zIn;
  char *zCur;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  nJump = 1;
  zCur = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_null(pjStack_18);
  }
  else {
    zEnd = jx9_value_to_string(*(jx9_value **)zCur,&local_48);
    _nLen = zEnd + local_48;
    if ((1 < apArg_local._4_4_) && (nJump = jx9_value_to_int(*(jx9_value **)(zCur + 8)), nJump < 0))
    {
      nJump = 1;
    }
    for (; zString = zEnd, zEnd < _nLen; zEnd = zEnd + local_4c) {
      zIn = zEnd;
      while( true ) {
        bVar3 = false;
        if (zEnd < _nLen) {
          bVar3 = *zEnd != '&';
        }
        if (!bVar3) break;
        zEnd = zEnd + 1;
      }
      if (zString < zEnd) {
        jx9_result_string(pjStack_18,zString,(int)zEnd - (int)zString);
      }
      local_48 = (int)_nLen - (int)zEnd;
      local_4c = 1;
      if ((local_48 < 5) || (sVar2 = SyStrnicmp(zEnd,"&amp;",5), sVar2 != 0)) {
        if ((local_48 < 4) || (sVar2 = SyStrnicmp(zEnd,"&lt;",4), sVar2 != 0)) {
          if ((local_48 < 4) || (sVar2 = SyStrnicmp(zEnd,"&gt;",4), sVar2 != 0)) {
            if ((local_48 < 6) || (sVar2 = SyStrnicmp(zEnd,"&quot;",6), sVar2 != 0)) {
              if ((local_48 < 6) || (sVar2 = SyStrnicmp(zEnd,"&#039;",6), sVar2 != 0)) {
                if (local_48 < 1) {
                  return 0;
                }
                jx9_result_string(pjStack_18,"&",1);
              }
              else {
                if ((nJump & 2U) == 0) {
                  jx9_result_string(pjStack_18,"&#039;",6);
                }
                else {
                  jx9_result_string(pjStack_18,"\'",1);
                }
                local_4c = 6;
              }
            }
            else {
              if ((nJump & 4U) == 0) {
                jx9_result_string(pjStack_18,"\"",1);
              }
              else {
                jx9_result_string(pjStack_18,"&quot;",6);
              }
              local_4c = 6;
            }
          }
          else {
            jx9_result_string(pjStack_18,">",1);
            local_4c = 4;
          }
        }
        else {
          jx9_result_string(pjStack_18,"<",1);
          local_4c = 4;
        }
      }
      else {
        jx9_result_string(pjStack_18,"&",1);
        local_4c = 5;
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_htmlspecialchars_decode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zCur, *zIn, *zEnd;
	int iFlags = 0x01; /* ENT_COMPAT */
	int nLen, nJump;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	/* Extract the flags if available */
	if( nArg > 1 ){
		iFlags = jx9_value_to_int(apArg[1]);
		if( iFlags < 0 ){
			iFlags = 0x01;
		}
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			break;
		}
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '&' ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Append the raw string verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
		nLen = (int)(zEnd-zIn);
		nJump = (int)sizeof(char);
		if( nLen >= (int)sizeof("&amp;")-1 && SyStrnicmp(zIn, "&amp;", sizeof("&amp;")-1) == 0 ){
			/* &amp; ==> '&' */
			jx9_result_string(pCtx, "&", (int)sizeof(char));
			nJump = (int)sizeof("&amp;")-1;
		}else if( nLen >= (int)sizeof("&lt;")-1 && SyStrnicmp(zIn, "&lt;", sizeof("&lt;")-1) == 0 ){
			/* &lt; ==> < */
			jx9_result_string(pCtx, "<", (int)sizeof(char));
			nJump = (int)sizeof("&lt;")-1; 
		}else if( nLen >= (int)sizeof("&gt;")-1 && SyStrnicmp(zIn, "&gt;", sizeof("&gt;")-1) == 0 ){
			/* &gt; ==> '>' */
			jx9_result_string(pCtx, ">", (int)sizeof(char));
			nJump = (int)sizeof("&gt;")-1; 
		}else if( nLen >= (int)sizeof("&quot;")-1 && SyStrnicmp(zIn, "&quot;", sizeof("&quot;")-1) == 0 ){
			/* &quot; ==> '"' */
			if( (iFlags & 0x04) == 0 /*ENT_NOQUOTES*/ ){
				jx9_result_string(pCtx, "\"", (int)sizeof(char));
			}else{
				/* Leave untouched */
				jx9_result_string(pCtx, "&quot;", (int)sizeof("&quot;")-1);
			}
			nJump = (int)sizeof("&quot;")-1;
		}else if( nLen >= (int)sizeof("&#039;")-1 && SyStrnicmp(zIn, "&#039;", sizeof("&#039;")-1) == 0 ){
			/* &#039; ==> ''' */
			if( iFlags & 0x02 /*ENT_QUOTES*/ ){
				/* Expand ''' */
				jx9_result_string(pCtx, "'", (int)sizeof(char));
			}else{
				/* Leave untouched */
				jx9_result_string(pCtx, "&#039;", (int)sizeof("&#039;")-1);
			}
			nJump = (int)sizeof("&#039;")-1;
		}else if( nLen >= (int)sizeof(char) ){
			/* expand '&' */
			jx9_result_string(pCtx, "&", (int)sizeof(char));
		}else{
			/* No more input to process */
			break;
		}
		zIn += nJump;
	}
	return JX9_OK;
}